

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrowingArray.h
# Opt level: O3

void __thiscall
JsUtil::GrowingArray<unsigned_int,_Memory::ArenaAllocator>::EnsureArray
          (GrowingArray<unsigned_int,_Memory::ArenaAllocator> *this)

{
  size_t dstCount;
  uint uVar1;
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *pAVar2;
  code *pcVar3;
  bool bVar4;
  BOOL BVar5;
  undefined4 *puVar6;
  uint *dst;
  Type puVar7;
  
  if (this->buffer == (Type)0x0) {
    uVar1 = this->length;
    if ((ulong)uVar1 == 0) {
      puVar7 = (Type)&DAT_00000008;
    }
    else {
      pAVar2 = &this->alloc->
                super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
      BVar5 = ExceptionCheck::CanHandleOutOfMemory();
      if (BVar5 == 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar6 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                           ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                           "ExceptionCheck::CanHandleOutOfMemory()");
        if (!bVar4) goto LAB_0056aa63;
        *puVar6 = 0;
      }
      puVar7 = (Type)Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
                     AllocInternal(pAVar2,(ulong)uVar1 << 2);
      if (puVar7 == (Type)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar6 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                           ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
        if (!bVar4) {
LAB_0056aa63:
          pcVar3 = (code *)invalidInstructionException();
          (*pcVar3)();
        }
        *puVar6 = 0;
        puVar7 = (Type)0x0;
      }
    }
    this->buffer = puVar7;
    this->count = 0;
  }
  else {
    uVar1 = this->count;
    if (uVar1 == this->length) {
      if (0x7ffffffe < uVar1) {
LAB_0056aa5e:
        Math::DefaultOverflowPolicy();
      }
      pAVar2 = &this->alloc->
                super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
      BVar5 = ExceptionCheck::CanHandleOutOfMemory();
      if (BVar5 == 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar6 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                           ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                           "ExceptionCheck::CanHandleOutOfMemory()");
        if (!bVar4) goto LAB_0056aa63;
        *puVar6 = 0;
      }
      dst = (uint *)Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
                    AllocInternal(pAVar2,(ulong)uVar1 * 8 + 8);
      if (dst == (uint *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar6 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                           ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
        if (!bVar4) goto LAB_0056aa63;
        *puVar6 = 0;
      }
      dstCount = (ulong)uVar1 * 2 + 2;
      Memory::CopyArray<unsigned_int,unsigned_int,Memory::ArenaAllocator>
                (dst,dstCount,this->buffer,(ulong)this->length);
      uVar1 = this->length;
      if ((ulong)uVar1 != 0) {
        if (0x3fffffff < uVar1) goto LAB_0056aa5e;
        Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::Free
                  (&this->alloc->
                    super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>,
                   this->buffer,(ulong)uVar1 << 2);
      }
      this->length = (Type)dstCount;
      this->buffer = dst;
    }
  }
  return;
}

Assistant:

void EnsureArray()
        {
            if (buffer == nullptr)
            {
                buffer = AllocateArray<AllocatorType, TValue, false>(
                    TRACK_ALLOC_INFO(alloc, TValue, AllocatorType, 0, length),
                    TypeAllocatorFunc<TAllocator, TValue>::GetAllocFunc(),
                    length);
                count = 0;
            }
            else if (count == length)
            {
                uint32 newLength = UInt32Math::AddMul<1, 2>(length);
                TValue * newbuffer = AllocateArray<AllocatorType, TValue, false>(
                    TRACK_ALLOC_INFO(alloc, TValue, AllocatorType, 0, newLength),
                    TypeAllocatorFunc<TAllocator, TValue>::GetAllocFunc(),
                    newLength);
                CopyArray<TValue, TValue, TAllocator>(newbuffer, newLength, buffer, length);
#ifdef DIAG_MEM
                listFreeAmount += length;
#endif
                if (length != 0)
                {
                    const size_t lengthByteSize = UInt32Math::Mul(length, sizeof(TValue));
                    AllocatorFree(alloc, (TypeAllocatorFunc<TAllocator, int>::GetFreeFunc()), buffer, lengthByteSize);
                }
                length = newLength;
                buffer = newbuffer;
            }
        }